

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine.cpp
# Opt level: O0

void __thiscall
QNativeSocketEnginePrivate::~QNativeSocketEnginePrivate(QNativeSocketEnginePrivate *this)

{
  void *in_RDI;
  
  ~QNativeSocketEnginePrivate((QNativeSocketEnginePrivate *)0x25e16c);
  operator_delete(in_RDI,0xf8);
  return;
}

Assistant:

QNativeSocketEnginePrivate::~QNativeSocketEnginePrivate()
{
}